

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfd::capi::CfdCapiManager::CopyHandle
          (CfdCapiManager *this,void *source,void *destination,bool error_state_only)

{
  int iVar1;
  undefined8 uVar2;
  byte in_CL;
  void *in_RDX;
  void *in_RSI;
  size_t len;
  CfdCapiHandleData *dest_data;
  CfdCapiHandleData *source_data;
  string *in_stack_ffffffffffffff80;
  CfdError in_stack_ffffffffffffff8c;
  CfdException *in_stack_ffffffffffffff90;
  CfdSourceLocation local_50;
  size_t local_38;
  void *local_30;
  void *local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  if ((in_RSI != (void *)0x0) && (in_RDX != (void *)0x0)) {
    local_38 = 0xf;
    local_30 = in_RDX;
    local_28 = in_RSI;
    iVar1 = memcmp(in_RSI,"CapiHandleData",0xf);
    if ((iVar1 != 0) || (iVar1 = memcmp(local_30,"CapiHandleData",local_38), iVar1 != 0)) {
      local_50.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                   ,0x2f);
      local_50.filename = local_50.filename + 1;
      local_50.line = 0x187;
      local_50.funcname = "CopyHandle";
      core::logger::warn<>(&local_50,"Illegal handle data. prefix unmatch.");
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff90,"Illegal handle data.",
                 (allocator *)&stack0xffffffffffffff8f);
      core::CfdException::CfdException
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
      __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if ((local_19 & 1) != 0) {
      *(undefined4 *)((long)local_30 + 0x10) = *(undefined4 *)((long)local_28 + 0x10);
      memcpy((void *)((long)local_30 + 0x15),(void *)((long)local_28 + 0x15),0x100);
    }
  }
  return;
}

Assistant:

void CfdCapiManager::CopyHandle(
    void* source, void* destination, bool error_state_only) const {
  if ((source != nullptr) && (destination != nullptr)) {
    CfdCapiHandleData* source_data = static_cast<CfdCapiHandleData*>(source);
    CfdCapiHandleData* dest_data =
        static_cast<CfdCapiHandleData*>(destination);
    size_t len = strlen(kPrefixHandleData) + 1;
    if ((memcmp(source_data->prefix, kPrefixHandleData, len) != 0) ||
        (memcmp(dest_data->prefix, kPrefixHandleData, len) != 0)) {
      warn(CFD_LOG_SOURCE, "Illegal handle data. prefix unmatch.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal handle data.");
    }

    if (error_state_only) {
      dest_data->error_code = source_data->error_code;
      memcpy(
          dest_data->error_message, source_data->error_message,
          sizeof(dest_data->error_message));
    } else {
      // TODO(k-matsuzawa): Currently there is no information to copy
      // bool is_outside = dest_data->is_outside;
      // memcpy(dest_data, source_data, sizeof(CfdCapiHandleData));
      // dest_data->is_outside = is_outside;
    }
  }
}